

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms443.cpp
# Opt level: O0

double wew_b(double x,double *en)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double zn;
  double y;
  double wn;
  double temp;
  double f;
  double c4;
  double c3;
  double c2;
  double c1;
  double *en_local;
  double x_local;
  
  dVar1 = log(x);
  if (0.7385 < x) {
    y = dVar1 - (((dVar1 + 2.0) * dVar1 + -3.0) * 24.0) / ((dVar1 * 0.7 + 58.0) * dVar1 + 127.0);
  }
  else {
    y = (x * (x * 1.3333333333333333 + 1.0)) /
        (x * (x * 0.8333333333333334 + 2.3333333333333335) + 1.0);
  }
  dVar2 = log(y);
  dVar2 = (dVar1 - y) - dVar2;
  dVar1 = y + 1.0;
  dVar3 = dVar1 * 2.0 * (dVar2 * 0.6666666666666666 + dVar1) + -dVar2;
  *en = (dVar2 * dVar3) / (dVar1 * (dVar3 - dVar2));
  return y * (*en + 1.0);
}

Assistant:

double wew_b ( double x, double &en )

//****************************************************************************80
//
//  Purpose:
//
//    WEW_B estimates Lambert's W function.
//
//  Discussion:
//
//    For a given X, this routine estimates the solution W of Lambert's 
//    equation:
//
//      X = W * EXP ( W )
//
//    This routine has lower accuracy than WEW_A.
//
//  Modified:
//
//    11 June 2014
//
//  Reference:
//
//    Fred Fritsch, R Shafer, W Crowley,
//    Algorithm 443: Solution of the transcendental equation w e^w = x,
//    Communications of the ACM,
//    October 1973, Volume 16, Number 2, pages 123-124.
//
//  Parameters:
//
//    Input, double X, the argument of W(X)
//
//    Output, double &EN, the last relative correction to W(X).
//
//    Output, double WEW_B, the estimated value of W(X).
//
{
  const double c1 = 4.0 / 3.0;
  const double c2 = 7.0 / 3.0;
  const double c3 = 5.0 / 6.0;
  const double c4 = 2.0 / 3.0;
  double f;
  double temp;
  double wn;
  double y;
  double zn;
//
//  Initial guess.
//
  f = log ( x );

  if ( x <= 0.7385 )
  {
    wn = x * ( 1.0 + c1 * x ) / ( 1.0 + x * ( c2 + c3 * x ) );
  }
  else
  {
    wn = f - 24.0 * ( ( f + 2.0 ) * f - 3.0 ) 
      / ( ( 0.7 * f + 58.0 ) * f + 127.0 );
  }
//
//  Iteration 1.
//
  zn = f - wn - log ( wn );
  temp = 1.0 + wn;
  y = 2.0 * temp * ( temp + c4 * zn ) - zn;
  en = zn * y / ( temp * ( y - zn ) );
  wn = wn * ( 1.0 + en );

  return wn;
}